

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O3

int __thiscall capnp::SchemaLoader::InitializerImpl::init(InitializerImpl *this,EVP_PKEY_CTX *ctx)

{
  LazyLoadCallback *pLVar1;
  Mutex *this_00;
  int in_EAX;
  int extraout_EAX;
  Fault f;
  RawSchema *schema_local;
  DebugComparison<capnp::_::RawSchema_*&,_const_capnp::_::RawSchema_*&> _kjCondition;
  Locked<const_kj::Own<capnp::SchemaLoader::Impl,_std::nullptr_t>_> lock;
  RawSchema *mutableSchema;
  
  pLVar1 = (this->callback).ptr;
  schema_local = (RawSchema *)ctx;
  if (pLVar1 != (LazyLoadCallback *)0x0) {
    in_EAX = (*(code *)**(undefined8 **)pLVar1)(pLVar1,this->loader,*(undefined8 *)ctx);
  }
  if (*(long *)(ctx + 0x40) != 0) {
    this_00 = (Mutex *)this->loader;
    _kjCondition.left = (RawSchema **)((ulong)_kjCondition.left & 0xffffffffffffff00);
    kj::_::Mutex::lock(this_00,1);
    f.exception = *(Exception **)ctx;
    kj::
    Table<kj::HashMap<unsigned_long,capnp::_::RawSchema*>::Entry,kj::HashIndex<kj::HashMap<unsigned_long,capnp::_::RawSchema*>::Callbacks>>
    ::find<0ul,unsigned_long&>
              ((Table<kj::HashMap<unsigned_long,capnp::_::RawSchema*>::Entry,kj::HashIndex<kj::HashMap<unsigned_long,capnp::_::RawSchema*>::Callbacks>>
                *)&_kjCondition,(unsigned_long *)&this_00[1].waitersHead.ptr[2].prev);
    if (_kjCondition.left == (RawSchema **)0x0) {
      mutableSchema = (RawSchema *)0x0;
    }
    else {
      mutableSchema = _kjCondition.left[1];
    }
    _kjCondition.left = &mutableSchema;
    _kjCondition.right = &schema_local;
    _kjCondition.op.content.ptr = " == ";
    _kjCondition.op.content.size_ = 5;
    _kjCondition.result = mutableSchema == (RawSchema *)ctx;
    if (!_kjCondition.result) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::RawSchema*&,capnp::_::RawSchema_const*&>&,char_const(&)[60]>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
                 ,0x823,FAILED,"mutableSchema == schema",
                 "_kjCondition,\"A schema not belonging to this loader used its initializer.\"",
                 &_kjCondition,
                 (char (*) [60])"A schema not belonging to this loader used its initializer.");
      kj::_::Debug::Fault::fatal(&f);
    }
    mutableSchema->lazyInitializer = (Initializer *)0x0;
    (mutableSchema->defaultBrand).lazyInitializer = (Initializer *)0x0;
    kj::_::Mutex::unlock(this_00,SHARED,(Waiter *)0x0);
    in_EAX = extraout_EAX;
  }
  return in_EAX;
}

Assistant:

void SchemaLoader::InitializerImpl::init(const _::RawSchema* schema) const {
  KJ_IF_SOME(c, callback) {
    c.load(loader, schema->id);
  }

  if (schema->lazyInitializer != nullptr) {
    // The callback declined to load a schema.  We need to disable the initializer so that it
    // doesn't get invoked again later, as we can no longer modify this schema once it is in use.

    // Lock the loader for read to make sure no one is concurrently loading a replacement for this
    // schema node.
    auto lock = loader.impl.lockShared();

    // Get the mutable version of the schema.
    _::RawSchema* mutableSchema = lock->get()->tryGet(schema->id).schema;
    KJ_ASSERT(mutableSchema == schema,
              "A schema not belonging to this loader used its initializer.");

    // Disable the initializer.
#if __GNUC__ || defined(__clang__)
    __atomic_store_n(&mutableSchema->lazyInitializer, nullptr, __ATOMIC_RELEASE);
    __atomic_store_n(&mutableSchema->defaultBrand.lazyInitializer, nullptr, __ATOMIC_RELEASE);
#elif _MSC_VER
    std::atomic_thread_fence(std::memory_order_release);
    *static_cast<_::RawSchema::Initializer const* volatile*>(
        &mutableSchema->lazyInitializer) = nullptr;
    *static_cast<_::RawBrandedSchema::Initializer const* volatile*>(
        &mutableSchema->defaultBrand.lazyInitializer) = nullptr;
#else
#error "Platform not supported"
#endif
  }
}